

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.h
# Opt level: O3

tuple_base<std::integer_sequence<unsigned_long,_0UL,_1UL>,_Fixpp::Field<Fixpp::TagT<888U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<889U,_Fixpp::Type::String>_>_>
* __thiscall
meta::impl::
tuple_base<std::integer_sequence<unsigned_long,0ul,1ul>,Fixpp::Field<Fixpp::TagT<888u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<889u,Fixpp::Type::String>>>
::operator=(tuple_base<std::integer_sequence<unsigned_long,0ul,1ul>,Fixpp::Field<Fixpp::TagT<888u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<889u,Fixpp::Type::String>>>
            *this,tuple<Fixpp::Field<Fixpp::TagT<888U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<889U,_Fixpp::Type::String>_>_>
                  *v)

{
  tuple_base<std::integer_sequence<unsigned_long,0ul,1ul>,Fixpp::Field<Fixpp::TagT<888u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<889u,Fixpp::Type::String>>>
  tVar1;
  
  tVar1 = (tuple_base<std::integer_sequence<unsigned_long,0ul,1ul>,Fixpp::Field<Fixpp::TagT<888u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<889u,Fixpp::Type::String>>>
           )(v->base).
            super_tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<888U,_Fixpp::Type::String>_>,_false>.
            value.empty_;
  if (tVar1 == (tuple_base<std::integer_sequence<unsigned_long,0ul,1ul>,Fixpp::Field<Fixpp::TagT<888u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<889u,Fixpp::Type::String>>>
                )0x0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)v);
    tVar1 = (tuple_base<std::integer_sequence<unsigned_long,0ul,1ul>,Fixpp::Field<Fixpp::TagT<888u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<889u,Fixpp::Type::String>>>
             )(v->base).
              super_tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<888U,_Fixpp::Type::String>_>,_false>.
              value.empty_;
  }
  this[0x20] = tVar1;
  tVar1 = (tuple_base<std::integer_sequence<unsigned_long,0ul,1ul>,Fixpp::Field<Fixpp::TagT<888u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<889u,Fixpp::Type::String>>>
           )(v->base).
            super_tuple_value<1UL,_Fixpp::Field<Fixpp::TagT<889U,_Fixpp::Type::String>_>,_false>.
            value.empty_;
  if (tVar1 == (tuple_base<std::integer_sequence<unsigned_long,0ul,1ul>,Fixpp::Field<Fixpp::TagT<888u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<889u,Fixpp::Type::String>>>
                )0x0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 0x28),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &(v->base).
                super_tuple_value<1UL,_Fixpp::Field<Fixpp::TagT<889U,_Fixpp::Type::String>_>,_false>
              );
    tVar1 = (tuple_base<std::integer_sequence<unsigned_long,0ul,1ul>,Fixpp::Field<Fixpp::TagT<888u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<889u,Fixpp::Type::String>>>
             )(v->base).
              super_tuple_value<1UL,_Fixpp::Field<Fixpp::TagT<889U,_Fixpp::Type::String>_>,_false>.
              value.empty_;
  }
  this[0x48] = tVar1;
  return (tuple_base<std::integer_sequence<unsigned_long,_0UL,_1UL>,_Fixpp::Field<Fixpp::TagT<888U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<889U,_Fixpp::Type::String>_>_>
          *)this;
}

Assistant:

tuple_base& operator=( const tuple< Us... >& v )
        noexcept( seq::is_all< std::is_nothrow_assignable< Ts&, const Us& >::value... >::value )
      {
#ifdef FIXPP_META_FOLD_EXPRESSIONS
        ( tuple_value< Is, Ts >::operator=( get< Is >( v ) ), ... );
#else
        (void)swallow{ ( tuple_value< Is, Ts >::operator=( meta::get< Is >( v ) ), true )..., true };
#endif
        return *this;
      }